

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_DataStructures_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/DataStructures.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_FeatureTypes_2eproto::InitDefaults();
  DAT_003df3c0 = (undefined8 *)0x0;
  _DAT_003df3c8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_003df3d0 = 0;
  uRam00000000003df3d8 = 0;
  _DAT_003df3e0 = 0;
  _StringToInt64Map_MapEntry_default_instance_ = &PTR__MapEntryImpl_003cf870;
  DAT_003df3e8 = 1;
  StringToInt64Map::StringToInt64Map((StringToInt64Map *)&_StringToInt64Map_default_instance_);
  DAT_003df428 = 1;
  _DAT_003df450 = 0;
  DAT_003df438 = (undefined8 *)0x0;
  uRam00000000003df440 = 0;
  _DAT_003df448 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_003df458 = 0;
  _Int64ToStringMap_MapEntry_default_instance_ = &PTR__MapEntryImpl_003cf9f0;
  DAT_003df460 = 1;
  Int64ToStringMap::Int64ToStringMap((Int64ToStringMap *)&_Int64ToStringMap_default_instance_);
  DAT_003df4a0 = 1;
  DAT_003df4b0 = (undefined8 *)0x0;
  _DAT_003df4b8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_003df4c0 = 0;
  uRam00000000003df4c8 = 0;
  _DAT_003df4d0 = 0;
  _StringToDoubleMap_MapEntry_default_instance_ = &PTR__MapEntryImpl_003cfb70;
  DAT_003df4d8 = 1;
  StringToDoubleMap::StringToDoubleMap((StringToDoubleMap *)&_StringToDoubleMap_default_instance_);
  DAT_003df518 = 1;
  DAT_003df528 = (undefined8 *)0x0;
  uRam00000000003df530 = 0;
  _DAT_003df538 = 0;
  uRam00000000003df540 = 0;
  _DAT_003df548 = 0;
  _Int64ToDoubleMap_MapEntry_default_instance_ = &PTR__MapEntryImpl_003cfcf0;
  DAT_003df550 = 1;
  Int64ToDoubleMap::Int64ToDoubleMap((Int64ToDoubleMap *)&_Int64ToDoubleMap_default_instance_);
  DAT_003df590 = 1;
  StringVector::StringVector((StringVector *)&_StringVector_default_instance_);
  DAT_003df5c8 = 1;
  Int64Vector::Int64Vector((Int64Vector *)&_Int64Vector_default_instance_);
  DAT_003df5f8 = 1;
  FloatVector::FloatVector((FloatVector *)&_FloatVector_default_instance_);
  DAT_003df628 = 1;
  DoubleVector::DoubleVector((DoubleVector *)&_DoubleVector_default_instance_);
  DAT_003df658 = 1;
  Int64Range::Int64Range((Int64Range *)&_Int64Range_default_instance_);
  DAT_003df688 = 1;
  Int64Set::Int64Set((Int64Set *)&_Int64Set_default_instance_);
  DAT_003df6b8 = 1;
  DoubleRange::DoubleRange((DoubleRange *)&_DoubleRange_default_instance_);
  DAT_003df6e8 = 1;
  DAT_003df3c0 = &_StringToInt64Map_MapEntry_default_instance_;
  DAT_003df438 = &_Int64ToStringMap_MapEntry_default_instance_;
  DAT_003df4b0 = &_StringToDoubleMap_MapEntry_default_instance_;
  DAT_003df528 = &_Int64ToDoubleMap_MapEntry_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_FeatureTypes_2eproto::InitDefaults();
  _StringToInt64Map_MapEntry_default_instance_.DefaultConstruct();
  _StringToInt64Map_default_instance_.DefaultConstruct();
  _Int64ToStringMap_MapEntry_default_instance_.DefaultConstruct();
  _Int64ToStringMap_default_instance_.DefaultConstruct();
  _StringToDoubleMap_MapEntry_default_instance_.DefaultConstruct();
  _StringToDoubleMap_default_instance_.DefaultConstruct();
  _Int64ToDoubleMap_MapEntry_default_instance_.DefaultConstruct();
  _Int64ToDoubleMap_default_instance_.DefaultConstruct();
  _StringVector_default_instance_.DefaultConstruct();
  _Int64Vector_default_instance_.DefaultConstruct();
  _FloatVector_default_instance_.DefaultConstruct();
  _DoubleVector_default_instance_.DefaultConstruct();
  _Int64Range_default_instance_.DefaultConstruct();
  _Int64Set_default_instance_.DefaultConstruct();
  _DoubleRange_default_instance_.DefaultConstruct();
  _StringToInt64Map_MapEntry_default_instance_.get_mutable()->set_default_instance(_StringToInt64Map_MapEntry_default_instance_.get_mutable());
  _StringToInt64Map_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Int64ToStringMap_MapEntry_default_instance_.get_mutable()->set_default_instance(_Int64ToStringMap_MapEntry_default_instance_.get_mutable());
  _Int64ToStringMap_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _StringToDoubleMap_MapEntry_default_instance_.get_mutable()->set_default_instance(_StringToDoubleMap_MapEntry_default_instance_.get_mutable());
  _StringToDoubleMap_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Int64ToDoubleMap_MapEntry_default_instance_.get_mutable()->set_default_instance(_Int64ToDoubleMap_MapEntry_default_instance_.get_mutable());
  _Int64ToDoubleMap_MapEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
}